

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_avx2.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution1D_x86_avx2::create_pipeline(Convolution1D_x86_avx2 *this,Option *opt)

{
  uint _c;
  _func_int *p_Var1;
  int iVar2;
  ulong uVar3;
  void *pvVar4;
  int _h;
  ulong uVar5;
  int k;
  int iVar6;
  ulong uVar7;
  long lVar8;
  undefined4 *puVar9;
  ulong uVar10;
  long lVar11;
  int j;
  int iVar12;
  int iVar13;
  Mat g0;
  Mat local_c0;
  Mat weight_data_r2;
  
  p_Var1 = this->_vptr_Convolution1D_x86_avx2[-3];
  if (*(int *)(&this->field_0x140 + (long)p_Var1) == 0) {
    _c = *(uint *)(&this->field_0xd0 + (long)p_Var1);
    uVar10 = (long)*(int *)(&this->field_0xf0 + (long)p_Var1) /
             (long)*(int *)(&this->field_0xd4 + (long)p_Var1);
    uVar10 = (long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff) /
             (long)(int)_c;
    _h = (int)uVar10;
    if (opt->use_packing_layout == true) {
      uVar7 = (ulong)((uVar10 & 3) == 0) * 3 + 1;
      if ((uVar10 & 7) == 0) {
        uVar7 = 8;
      }
      uVar3 = (ulong)((_c & 3) == 0) * 3 + 1;
      if ((_c & 7) == 0) {
        uVar3 = 8;
      }
    }
    else {
      uVar7 = 1;
      uVar3 = uVar7;
    }
    Mat::reshape(&weight_data_r2,(Mat *)(&this->field_0x148 + (long)p_Var1),
                 *(int *)(&this->field_0xd4 + (long)p_Var1),_h,_c,(Allocator *)0x0);
    iVar6 = (int)uVar7;
    iVar12 = (int)uVar3;
    Mat::create(&this->weight_data_packed,
                *(int *)(&this->field_0xd4 + (long)this->_vptr_Convolution1D_x86_avx2[-3]),
                (int)((long)((ulong)(uint)(_h >> 0x1f) << 0x20 | uVar10 & 0xffffffff) / (long)iVar6)
                ,*(int *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_avx2[-3]) / iVar12
                ,(ulong)(uint)(iVar12 * iVar6 * 4),iVar12 * iVar6,(Allocator *)0x0);
    uVar10 = 0;
    while (iVar2 = (int)uVar10,
          iVar12 + -1 + iVar2 <
          *(int *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_avx2[-3])) {
      Mat::channel(&g0,&this->weight_data_packed,(int)(uVar10 / uVar3));
      for (uVar10 = 0; (long)uVar10 < (long)((long)_h - (ulong)(iVar6 - 1)); uVar10 = uVar10 + uVar7
          ) {
        puVar9 = (undefined4 *)
                 ((long)(int)((uVar10 & 0xffffffff) / uVar7) * (long)g0.w * g0.elemsize +
                 (long)g0.data);
        for (lVar8 = 0;
            lVar8 < *(int *)(&this->field_0xd4 + (long)this->_vptr_Convolution1D_x86_avx2[-3]);
            lVar8 = lVar8 + 1) {
          for (uVar5 = 0; uVar5 != uVar7; uVar5 = uVar5 + 1) {
            for (iVar13 = 0; iVar12 != iVar13; iVar13 = iVar13 + 1) {
              Mat::channel(&local_c0,&weight_data_r2,iVar13 + iVar2);
              pvVar4 = local_c0.data;
              lVar11 = (long)local_c0.w * (uVar5 + uVar10) * local_c0.elemsize;
              Mat::~Mat(&local_c0);
              *puVar9 = *(undefined4 *)((long)pvVar4 + lVar8 * 4 + lVar11);
              puVar9 = puVar9 + 1;
            }
          }
        }
      }
      Mat::~Mat(&g0);
      uVar10 = (ulong)(uint)(iVar2 + iVar12);
    }
    Mat::~Mat(&weight_data_r2);
  }
  return 0;
}

Assistant:

int Convolution1D_x86_avx2::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    int num_input = weight_data_size / kernel_w / num_output;

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // src = kw-inch-outch
    // dst = pb-pa-kw-inch/pa-outch/pb
    {
        Mat weight_data_r2 = weight_data.reshape(kernel_w, num_input, num_output);

        weight_data_packed.create(kernel_w, num_input / elempack, num_output / out_elempack, (size_t)4u * elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            Mat g0 = weight_data_packed.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                float* g00 = g0.row(p / elempack);

                for (int k = 0; k < kernel_w; k++)
                {
                    for (int i = 0; i < elempack; i++)
                    {
                        for (int j = 0; j < out_elempack; j++)
                        {
                            const float* k00 = weight_data_r2.channel(q + j).row(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }

    return 0;
}